

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_insert.cpp
# Opt level: O1

bool duckdb::PhysicalPlanGenerator::UseBatchIndex(ClientContext *context,PhysicalOperator *plan)

{
  bool bVar1;
  int32_t iVar2;
  TaskScheduler *this;
  
  this = TaskScheduler::GetScheduler(context);
  iVar2 = TaskScheduler::NumberOfThreads(this);
  if (iVar2 == 1) {
    return false;
  }
  bVar1 = PhysicalOperator::AllSourcesSupportBatchIndex(plan);
  return bVar1;
}

Assistant:

bool PhysicalPlanGenerator::UseBatchIndex(ClientContext &context, PhysicalOperator &plan) {
	auto &scheduler = TaskScheduler::GetScheduler(context);
	if (scheduler.NumberOfThreads() == 1) {
		// batch index usage only makes sense if we are using multiple threads
		return false;
	}
	if (!plan.AllSourcesSupportBatchIndex()) {
		// batch index is not supported
		return false;
	}
	return true;
}